

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>,_bool>
* __thiscall
phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
::insert_unique<int>
          (pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>,_bool>
           *__return_storage_ptr__,
          btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
          *this,key_type *key,int *args)

{
  bool bVar1;
  node_type *pnVar2;
  node_type **ppnVar3;
  key_type *y;
  SearchResult<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>,_false>
  SVar4;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
  bVar5;
  iterator iVar6;
  bool local_a9;
  btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
  *local_a8;
  int local_a0;
  undefined8 local_98;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
  local_80;
  bool local_69;
  btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
  *local_68;
  int local_60;
  iterator *local_58;
  undefined8 uStack_50;
  undefined1 local_48 [8];
  iterator last;
  iterator *iter;
  SearchResult<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>,_false>
  res;
  int *args_local;
  key_type *key_local;
  btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
  *this_local;
  
  res.value._8_8_ = args;
  bVar1 = empty(this);
  if (bVar1) {
    pnVar2 = new_leaf_root_node(this,1);
    this->rightmost_ = pnVar2;
    ppnVar3 = mutable_root(this);
    *ppnVar3 = pnVar2;
  }
  SVar4 = internal_locate<int>(this,key);
  bVar5._8_8_ = SVar4.value._8_8_;
  local_58 = (iterator *)SVar4.value.node;
  res.value.node._0_4_ = SVar4.value.position;
  last._8_8_ = &iter;
  uStack_50 = CONCAT44(res.value.node._4_4_,(uint)res.value.node);
  bVar5.node = (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
                *)(ulong)(uint)res.value.node;
  iter = local_58;
  bVar5 = btree<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>::
          internal_last<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>,int&,int*>>
                    ((btree<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>
                      *)local_58,bVar5);
  local_68 = bVar5.node;
  local_60 = bVar5.position;
  local_48 = (undefined1  [8])local_68;
  last.node._0_4_ = local_60;
  if (local_68 !=
      (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
       *)0x0) {
    y = btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
        ::key((btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
               *)local_48);
    bVar1 = btree<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>::
            compare_keys<int,int>
                      ((btree<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>
                        *)this,key,y);
    if (!bVar1) {
      local_69 = false;
      std::
      pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>,_bool>
      ::
      pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>_&,_bool,_true>
                (__return_storage_ptr__,
                 (btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
                  *)local_48,&local_69);
      return __return_storage_ptr__;
    }
  }
  local_98 = *(undefined8 *)last._8_8_;
  uStack_90 = (undefined4)*(undefined8 *)(last._8_8_ + 8);
  uStack_8c = (undefined4)((ulong)*(undefined8 *)(last._8_8_ + 8) >> 0x20);
  iVar6._12_4_ = 0;
  iVar6._0_12_ = *(undefined1 (*) [12])last._8_8_;
  iVar6 = internal_emplace<int>(this,iVar6,(int *)res.value._8_8_);
  local_a8 = iVar6.node;
  local_a0 = iVar6.position;
  local_a9 = true;
  local_80.node = local_a8;
  local_80.position = local_a0;
  std::
  pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>,_bool>
  ::
  pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>,_bool,_true>
            (__return_storage_ptr__,&local_80,&local_a9);
  return __return_storage_ptr__;
}

Assistant:

auto btree<P>::insert_unique(const key_type &key, Args &&... args)
        -> std::pair<iterator, bool> {
        if (empty()) {
            mutable_root() = rightmost_ = new_leaf_root_node(1);
        }

        auto res = internal_locate(key);
        iterator &iter = res.value;

        if (res.HasMatch()) {
            if (res.IsEq()) {
                // The key already exists in the tree, do nothing.
                return {iter, false};
            }
        } else {
            iterator last = internal_last(iter);
            if (last.node && !compare_keys(key, last.key())) {
                // The key already exists in the tree, do nothing.
                return {last, false};
            }
        }
        return {internal_emplace(iter, std::forward<Args>(args)...), true};
    }